

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  BYTE *s;
  byte *pbVar10;
  byte *pbVar11;
  BYTE *d_1;
  byte *pbVar12;
  ulong uVar13;
  byte *pbVar14;
  byte *pbVar15;
  long lVar16;
  ushort *puVar17;
  ushort *puVar18;
  BYTE *d;
  byte *pbVar19;
  ulong uVar20;
  ulong uVar21;
  BYTE *e;
  int local_58;
  byte *local_38;
  
  if (source == (char *)0x0) {
    return -1;
  }
  lVar16 = dictSize + (long)dictStart;
  if (dictStart == (void *)0x0) {
    lVar16 = 0;
  }
  if (originalSize == 0) {
    return -(uint)(*source != '\0') | 1;
  }
  pbVar1 = (byte *)(dest + originalSize);
  local_58 = (int)source;
  pbVar19 = (byte *)dest;
  if (originalSize < 0x40) goto LAB_00113faa;
LAB_00113aa9:
  do {
    bVar3 = (byte)*(ushort *)source;
    uVar8 = (uint)bVar3;
    uVar7 = (uint)(bVar3 >> 4);
    if (uVar7 == 0xf) {
      uVar7 = 0;
      puVar18 = (ushort *)((long)source + 0x10);
      do {
        puVar17 = puVar18;
        uVar7 = uVar7 + *(byte *)((long)puVar17 + -0xf);
        puVar18 = (ushort *)((long)puVar17 + 1);
      } while (*(byte *)((long)puVar17 + -0xf) == 0xff);
      uVar13 = (ulong)uVar7;
      pbVar12 = pbVar19 + uVar13 + 0xf;
      if (dest + (long)originalSize + -8 < pbVar12) {
        uVar13 = uVar13 + 0xf;
        source = (char *)(puVar17 + -7);
        goto LAB_00113e58;
      }
      puVar18 = puVar17 + -7;
      do {
        *(undefined8 *)pbVar19 = *(undefined8 *)puVar18;
        pbVar19 = pbVar19 + 8;
        puVar18 = puVar18 + 4;
      } while (pbVar19 < pbVar12);
      puVar18 = (ushort *)((long)puVar17 + 1 + uVar13);
    }
    else {
      *(undefined8 *)pbVar19 = *(undefined8 *)((long)source + 1);
      if (0x8f < bVar3) {
        *(undefined8 *)(pbVar19 + 8) = *(undefined8 *)((long)source + 9);
      }
      pbVar12 = pbVar19 + uVar7;
      puVar18 = (ushort *)((byte *)((long)source + 1) + uVar7);
    }
    uVar4 = *puVar18;
    uVar20 = (ulong)uVar4;
    source = (char *)(puVar18 + 1);
    pbVar14 = pbVar12 + -uVar20;
    uVar13 = (ulong)(bVar3 & 0xf);
    if (uVar13 == 0xf) {
      uVar8 = 0;
      do {
        uVar6 = *(ushort *)source;
        source = (char *)((long)source + 1);
        uVar8 = uVar8 + (byte)uVar6;
      } while ((byte)uVar6 == 0xff);
      uVar21 = (ulong)uVar8 + 0x13;
      if (pbVar1 + -0x40 <= pbVar12 + (ulong)uVar8 + 0x13) break;
    }
    else {
      uVar21 = uVar13 + 4;
      if (pbVar1 + -0x40 <= pbVar12 + uVar13 + 4) break;
      if ((dest <= pbVar14) && (7 < uVar4)) {
        *(undefined8 *)pbVar12 = *(undefined8 *)pbVar14;
        *(undefined8 *)(pbVar12 + 8) = *(undefined8 *)(pbVar14 + 8);
        *(undefined2 *)(pbVar12 + 0x10) = *(undefined2 *)(pbVar14 + 0x10);
        pbVar19 = pbVar12 + uVar13 + 4;
        goto LAB_00113aa9;
      }
    }
    pbVar2 = pbVar12 + uVar21;
    pbVar19 = pbVar2;
    if (pbVar14 < dest) {
      if (pbVar2 <= pbVar1 + -5) {
        uVar13 = (long)dest - (long)pbVar14;
        uVar20 = uVar21 - uVar13;
        if (uVar21 < uVar13 || uVar20 == 0) {
          memmove(pbVar12,(void *)(lVar16 - uVar13),uVar21);
        }
        else {
          memcpy(pbVar12,(void *)(lVar16 - uVar13),uVar13);
          pbVar19 = pbVar12 + uVar13;
          if ((ulong)((long)pbVar19 - (long)dest) < uVar20) {
            pbVar12 = (byte *)dest;
            if (uVar13 < uVar21) {
              do {
                *pbVar19 = *pbVar12;
                pbVar19 = pbVar19 + 1;
                pbVar12 = pbVar12 + 1;
              } while (pbVar19 < pbVar2);
            }
          }
          else {
            memcpy(pbVar19,dest,uVar20);
            pbVar19 = pbVar2;
          }
        }
        goto LAB_00113aa9;
      }
      goto LAB_00113fe3;
    }
    if (uVar4 < 0x10) {
      if (uVar20 == 4) {
        iVar9 = *(int *)pbVar14;
      }
      else if (uVar4 == 2) {
        iVar9 = CONCAT22(*(undefined2 *)pbVar14,*(undefined2 *)pbVar14);
      }
      else {
        if (uVar4 != 1) {
          if (uVar4 < 8) {
            pbVar12[0] = 0;
            pbVar12[1] = 0;
            pbVar12[2] = 0;
            pbVar12[3] = 0;
            *pbVar12 = *pbVar14;
            pbVar12[1] = pbVar14[1];
            pbVar12[2] = pbVar14[2];
            pbVar12[3] = pbVar14[3];
            uVar8 = inc32table[uVar4];
            *(undefined4 *)(pbVar12 + 4) = *(undefined4 *)(pbVar14 + uVar8);
            pbVar14 = pbVar14 + ((ulong)uVar8 - (long)dec64table[uVar4]);
          }
          else {
            *(undefined8 *)pbVar12 = *(undefined8 *)pbVar14;
            pbVar14 = pbVar14 + 8;
          }
          pbVar12 = pbVar12 + 8;
          do {
            *(undefined8 *)pbVar12 = *(undefined8 *)pbVar14;
            pbVar12 = pbVar12 + 8;
            pbVar14 = pbVar14 + 8;
          } while (pbVar12 < pbVar2);
          goto LAB_00113aa9;
        }
        iVar9 = (uint)*pbVar14 * 0x1010101;
      }
      *(int *)pbVar12 = iVar9;
      *(int *)(pbVar12 + 4) = iVar9;
      if (8 < uVar21) {
        pbVar12 = pbVar12 + 8;
        do {
          *(int *)pbVar12 = iVar9;
          *(int *)(pbVar12 + 4) = iVar9;
          pbVar12 = pbVar12 + 8;
        } while (pbVar12 < pbVar2);
      }
      goto LAB_00113aa9;
    }
    do {
      uVar5 = *(undefined8 *)(pbVar12 + -uVar20 + 8);
      *(undefined8 *)pbVar12 = *(undefined8 *)(pbVar12 + -uVar20);
      *(undefined8 *)(pbVar12 + 8) = uVar5;
      uVar5 = *(undefined8 *)(pbVar12 + -uVar20 + 0x10 + 8);
      *(undefined8 *)(pbVar12 + 0x10) = *(undefined8 *)(pbVar12 + -uVar20 + 0x10);
      *(undefined8 *)(pbVar12 + 0x18) = uVar5;
      pbVar12 = pbVar12 + 0x20;
    } while (pbVar12 < pbVar2);
  } while( true );
LAB_00113eb6:
  pbVar2 = pbVar12 + uVar21;
  pbVar19 = pbVar2;
  if (pbVar14 < dest) {
    if (pbVar1 + -5 < pbVar2) goto LAB_00113fe3;
    uVar13 = (long)dest - (long)pbVar14;
    uVar20 = uVar21 - uVar13;
    if (uVar21 < uVar13 || uVar20 == 0) {
      memmove(pbVar12,(void *)(lVar16 - uVar13),uVar21);
    }
    else {
      memcpy(pbVar12,(void *)(lVar16 - uVar13),uVar13);
      pbVar19 = pbVar12 + uVar13;
      if ((ulong)((long)pbVar19 - (long)dest) < uVar20) {
        pbVar12 = (byte *)dest;
        if (uVar13 < uVar21) {
          do {
            *pbVar19 = *pbVar12;
            pbVar19 = pbVar19 + 1;
            pbVar12 = pbVar12 + 1;
          } while (pbVar19 < pbVar2);
        }
      }
      else {
        memcpy(pbVar19,dest,uVar20);
        pbVar19 = pbVar2;
      }
    }
  }
  else {
    if ((uint)uVar20 < 8) {
      LZ4_decompress_fast_extDict_cold_1();
      pbVar14 = local_38;
    }
    else {
      *(undefined8 *)pbVar12 = *(undefined8 *)pbVar14;
      pbVar14 = pbVar14 + 8;
    }
    pbVar10 = pbVar12 + 8;
    if (pbVar1 + -0xc < pbVar2) {
      if (pbVar1 + -5 < pbVar2) goto LAB_00113fe3;
      pbVar12 = pbVar1 + -7;
      pbVar11 = pbVar14;
      pbVar15 = pbVar10;
      if (pbVar10 < pbVar12) {
        do {
          *(undefined8 *)pbVar15 = *(undefined8 *)pbVar11;
          pbVar15 = pbVar15 + 8;
          pbVar11 = pbVar11 + 8;
        } while (pbVar15 < pbVar12);
        pbVar14 = pbVar14 + ((long)pbVar12 - (long)pbVar10);
        pbVar10 = pbVar12;
      }
      for (; pbVar10 < pbVar2; pbVar10 = pbVar10 + 1) {
        bVar3 = *pbVar14;
        pbVar14 = pbVar14 + 1;
        *pbVar10 = bVar3;
      }
    }
    else {
      *(undefined8 *)pbVar10 = *(undefined8 *)pbVar14;
      if (0x10 < uVar21) {
        pbVar12 = pbVar12 + 0x10;
        do {
          pbVar14 = pbVar14 + 8;
          *(undefined8 *)pbVar12 = *(undefined8 *)pbVar14;
          pbVar12 = pbVar12 + 8;
        } while (pbVar12 < pbVar2);
      }
    }
  }
LAB_00113faa:
  bVar3 = (byte)*(ushort *)source;
  source = (char *)((long)source + 1);
  while( true ) {
    uVar8 = (uint)bVar3;
    uVar13 = (ulong)(bVar3 >> 4);
    if ((0x8f < uVar8) || (dest + (long)originalSize + -0x1a < pbVar19)) break;
    *(undefined8 *)pbVar19 = *(undefined8 *)source;
    pbVar12 = pbVar19 + uVar13;
    uVar21 = (ulong)(uVar8 & 0xf);
    puVar18 = (ushort *)((long)source + uVar13);
    uVar20 = (ulong)*puVar18;
    pbVar14 = pbVar12 + -uVar20;
    if ((((uVar8 & 0xf) == 0xf) || (*puVar18 < 8)) || (pbVar14 < dest)) goto LAB_00113e90;
    *(undefined8 *)pbVar12 = *(undefined8 *)pbVar14;
    *(undefined8 *)(pbVar12 + 8) = *(undefined8 *)(pbVar14 + 8);
    *(undefined2 *)(pbVar12 + 0x10) = *(undefined2 *)(pbVar14 + 0x10);
    pbVar19 = pbVar12 + uVar21 + 4;
    bVar3 = *(byte *)((long)source + uVar13 + 2);
    source = (char *)((long)source + uVar13 + 3);
  }
  if (bVar3 >> 4 == 0xf) {
    uVar7 = 0;
    do {
      uVar4 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar7 = uVar7 + (byte)uVar4;
    } while ((byte)uVar4 == 0xff);
    uVar13 = (ulong)uVar7 + 0xf;
  }
  pbVar12 = pbVar19 + uVar13;
LAB_00113e58:
  puVar18 = (ushort *)source;
  if (dest + (long)originalSize + -8 < pbVar12) {
    if (pbVar12 == pbVar1) {
      memmove(pbVar19,source,uVar13);
      return ((int)source + (int)uVar13) - local_58;
    }
LAB_00113fe3:
    return ~(uint)source + local_58;
  }
  do {
    *(undefined8 *)pbVar19 = *(undefined8 *)puVar18;
    pbVar19 = pbVar19 + 8;
    puVar18 = puVar18 + 4;
  } while (pbVar19 < pbVar12);
  puVar18 = (ushort *)((long)source + uVar13);
  uVar20 = (ulong)*puVar18;
  pbVar14 = pbVar12 + -uVar20;
  uVar21 = (ulong)(uVar8 & 0xf);
LAB_00113e90:
  source = (char *)(puVar18 + 1);
  if ((int)uVar21 == 0xf) {
    uVar8 = 0;
    do {
      uVar4 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar8 = uVar8 + (byte)uVar4;
    } while ((byte)uVar4 == 0xff);
    uVar21 = (ulong)uVar8 + 0xf;
  }
  uVar21 = uVar21 + 4;
  goto LAB_00113eb6;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}